

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayoutPrivate::setupHfwLayoutData(QGridLayoutPrivate *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int start;
  QList<QLayoutStruct> *this_00;
  QLayoutStruct *pQVar3;
  QGridBox *this_01;
  int end;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  pointer pQVar9;
  int extraout_var;
  int extraout_var_00;
  int i_1;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  int i;
  uint width;
  long lVar14;
  int sizeHint;
  
  this_00 = this->hfwData;
  lVar10 = 0;
  for (lVar14 = 0; lVar14 < this->rr; lVar14 = lVar14 + 1) {
    pQVar3 = (this->rowData).d.ptr;
    pQVar9 = QList<QLayoutStruct>::data(this_00);
    puVar1 = (undefined8 *)((long)&pQVar3->stretch + lVar10);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pQVar3->spacing + lVar10);
    uVar5 = *puVar2;
    uVar6 = puVar2[1];
    puVar2 = (undefined8 *)((long)&pQVar9->stretch + lVar10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar1 = (undefined8 *)((long)&pQVar9->spacing + lVar10);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    iVar13 = (this->rMinHeights).d.ptr[lVar14];
    pQVar9 = QList<QLayoutStruct>::data(this_00);
    *(int *)((long)&pQVar9->sizeHint + lVar10) = iVar13;
    pQVar9 = QList<QLayoutStruct>::data(this_00);
    *(int *)((long)&pQVar9->minimumSize + lVar10) = iVar13;
    lVar10 = lVar10 + 0x20;
  }
  for (iVar13 = 0; iVar13 != 2; iVar13 = iVar13 + 1) {
    for (uVar11 = 0; uVar11 < (ulong)(this->things).d.size; uVar11 = uVar11 + 1) {
      this_01 = (this->things).d.ptr[uVar11];
      start = this_01->row;
      end = this->rr + -1;
      if (-1 < this_01->torow) {
        end = this_01->torow;
      }
      iVar7 = this->cc + -1;
      if (-1 < this_01->tocol) {
        iVar7 = this_01->tocol;
      }
      pQVar3 = (this->colData).d.ptr;
      width = (pQVar3[iVar7].size + pQVar3[iVar7].pos) - pQVar3[this_01->col].pos;
      if (start == end) {
        if (iVar13 == 0) {
          addHfwData(this,this_01,width);
        }
      }
      else if (iVar13 == 0) {
        initEmptyMultiBox(this_00,start,end);
      }
      else {
        (*this_01->item_->_vptr_QLayoutItem[2])();
        (*this_01->item_->_vptr_QLayoutItem[3])();
        iVar8 = (*this_01->item_->_vptr_QLayoutItem[9])();
        iVar7 = extraout_var_00;
        sizeHint = extraout_var;
        if ((char)iVar8 != '\0') {
          iVar8 = (*this_01->item_->_vptr_QLayoutItem[10])(this_01->item_,(ulong)width);
          sizeHint = extraout_var;
          if (extraout_var < iVar8) {
            sizeHint = iVar8;
          }
          iVar7 = extraout_var_00;
          if (extraout_var_00 < iVar8) {
            iVar7 = iVar8;
          }
        }
        iVar8 = QGridBox::vStretch(this_01);
        distributeMultiBox(this_00,start,end,iVar7,sizeHint,&this->rStretch,iVar8);
      }
    }
  }
  lVar10 = 0x14;
  for (lVar14 = 0; lVar14 < this->rr; lVar14 = lVar14 + 1) {
    pQVar3 = (this_00->d).ptr;
    bVar12 = true;
    if (*(char *)((long)&pQVar3->stretch + lVar10) == '\0') {
      bVar12 = 0 < *(int *)((long)pQVar3 + lVar10 + -0x14);
    }
    pQVar9 = QList<QLayoutStruct>::data(this_00);
    *(bool *)((long)&pQVar9->stretch + lVar10) = bVar12;
    lVar10 = lVar10 + 0x20;
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setupHfwLayoutData()
{
    QList<QLayoutStruct> &rData = *hfwData;
    for (int i = 0; i < rr; i++) {
        rData[i] = rowData.at(i);
        rData[i].minimumSize = rData[i].sizeHint = rMinHeights.at(i);
    }

    for (int pass = 0; pass < 2; ++pass) {
        for (int i = 0; i < things.size(); ++i) {
            QGridBox *box = things.at(i);
            int r1 = box->row;
            int c1 = box->col;
            int r2 = box->toRow(rr);
            int c2 = box->toCol(cc);
            int w = colData.at(c2).pos + colData.at(c2).size - colData.at(c1).pos;

            if (r1 == r2) {
                if (pass == 0)
                    addHfwData(box, w);
            } else {
                if (pass == 0) {
                    initEmptyMultiBox(rData, r1, r2);
                } else {
                    QSize hint = box->sizeHint();
                    QSize min = box->minimumSize();
                    if (box->hasHeightForWidth()) {
                        int hfwh = box->heightForWidth(w);
                        if (hfwh > hint.height())
                            hint.setHeight(hfwh);
                        if (hfwh > min.height())
                            min.setHeight(hfwh);
                    }
                    distributeMultiBox(rData, r1, r2, min.height(), hint.height(),
                                       rStretch, box->vStretch());
                }
            }
        }
    }
    for (int i = 0; i < rr; i++)
        rData[i].expansive = rData.at(i).expansive || rData.at(i).stretch > 0;
}